

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O2

DecodeStatus DecodeBitpOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus in_EAX;
  DecodeStatus extraout_EAX;
  
  if (0xb < Val) {
    return in_EAX;
  }
  MCOperand_CreateImm0(Inst,(ulong)DecodeBitpOperand::Values[Val]);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeBitpOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	static unsigned Values[] = {
		32 /*bpw*/, 1, 2, 3, 4, 5, 6, 7, 8, 16, 24, 32
	};

	if (Val > 11)
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, Values[Val]);
	return MCDisassembler_Success;
}